

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O1

int __thiscall Activation::remove(Activation *this,char *__filename)

{
  pointer *ppFVar1;
  pointer pFVar2;
  pointer pFVar3;
  ulong uVar4;
  void *pvVar5;
  pointer __src;
  
  uVar4 = (ulong)__filename & 0xffffffff;
  pFVar2 = (this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar3 = (this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (uVar4 < (ulong)((long)pFVar3 - (long)pFVar2 >> 5)) {
    pvVar5 = (void *)(uVar4 * 0x20);
    __src = (pointer)((long)pvVar5 + (long)(pFVar2 + 1));
    if (__src != pFVar3) {
      pvVar5 = memmove(pFVar2 + uVar4,__src,(long)pFVar3 - (long)__src);
    }
    ppFVar1 = &(this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppFVar1 = *ppFVar1 + -1;
    return (int)pvVar5;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [activation removal]: Index out of bounds!\n");
  exit(1);
}

Assistant:

void Activation::remove(unsigned index){
    if(index>=m_params.size()){
        std::cout<<"ERROR [activation removal]: Index out of bounds!\n";
        exit(1);
    }

    m_params.erase(m_params.begin()+index);
}